

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNGen.cpp
# Opt level: O2

int __thiscall
NaPNGenerator::verify
          (NaPNGenerator *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  NaVector *pNVar5;
  char *pcVar6;
  undefined8 unaff_RBP;
  undefined7 uVar7;
  
  if (this->pUnit == (NaUnit *)0x0) {
    pcVar6 = NaPetriNode::name(&this->super_NaPetriNode);
    iVar4 = 0;
    NaPrintLog("Unit is not defined for generator node \'%s\'.\n",pcVar6);
  }
  else {
    iVar1 = NaPetriConnector::links(&(this->time).super_NaPetriConnector);
    iVar2 = (*(this->pUnit->super_NaLogging)._vptr_NaLogging[10])();
    pNVar5 = NaPetriCnOutput::data(&this->y);
    iVar3 = (*pNVar5->_vptr_NaVector[6])(pNVar5);
    uVar7 = (undefined7)((ulong)unaff_RBP >> 8);
    iVar4 = (int)CONCAT71(uVar7,iVar2 == iVar3 && iVar1 < 1);
    if ((0 < iVar1) && (iVar2 == iVar3)) {
      pNVar5 = NaPetriCnInput::data(&this->time);
      iVar4 = (*pNVar5->_vptr_NaVector[6])(pNVar5);
      iVar4 = (int)CONCAT71(uVar7,iVar4 == 1);
    }
  }
  return iVar4;
}

Assistant:

bool
NaPNGenerator::verify ()
{
    if(NULL == pUnit){
        NaPrintLog("Unit is not defined for generator node '%s'.\n",
                   name());
        return false;
    }else if(time.links() > 0){
        return pUnit->OutputDim() == y.data().dim()
            && 1 == time.data().dim();
    }else{
        return pUnit->OutputDim() == y.data().dim();
    }
}